

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int gmfstatkwdf77_(int64_t *MshIdx,int *KwdIdx,int *NmbTyp,int *SolSiz,int *TypTab,int *deg,
                  int *NmbNod)

{
  int iVar1;
  int64_t iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint *in_RSI;
  int64_t *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  int local_4;
  
  iVar1 = strcmp(GmfKwdFmt[(int)*in_RSI][2],"hr");
  if (iVar1 == 0) {
    iVar2 = GmfStatKwd(*in_RDI,(int)(ulong)*in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008);
    local_4 = (int)iVar2;
  }
  else {
    iVar1 = strcmp(GmfKwdFmt[(int)*in_RSI][2],"sr");
    if (iVar1 == 0) {
      iVar2 = GmfStatKwd(*in_RDI,(int)(ulong)*in_RSI,in_RDX,in_RCX,in_R8);
      local_4 = (int)iVar2;
    }
    else {
      iVar2 = GmfStatKwd(*in_RDI,(int)(ulong)*in_RSI);
      local_4 = (int)iVar2;
    }
  }
  return local_4;
}

Assistant:

int APIF77(gmfstatkwdf77)( int64_t *MshIdx, int *KwdIdx, int *NmbTyp,
                           int *SolSiz, int *TypTab, int *deg, int *NmbNod )
{
   if(!strcmp(GmfKwdFmt[ *KwdIdx ][2], "hr"))
      return(GmfStatKwd(*MshIdx, *KwdIdx, NmbTyp, SolSiz, TypTab, deg, NmbNod));
   else if(!strcmp(GmfKwdFmt[ *KwdIdx ][2], "sr"))
      return(GmfStatKwd(*MshIdx, *KwdIdx, NmbTyp, SolSiz, TypTab));
   else
      return(GmfStatKwd(*MshIdx, *KwdIdx));
}